

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O0

void __thiscall KDReports::Test::testNoHeaders(Test *this)

{
  bool bVar1;
  byte bVar2;
  pointer pRVar3;
  Header *pHVar4;
  int iVar5;
  HeaderMap *headers;
  Report report;
  unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_> uStack_18;
  Test *local_10;
  Test *this_local;
  
  local_10 = this;
  KDReports::Report::Report((Report *)&headers,(QObject *)0x0);
  pRVar3 = std::unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
           ::operator->(&uStack_18);
  bVar1 = QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::isEmpty
                    ((QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*> *)(pRVar3 + 0x78)
                    );
  bVar2 = QTest::qVerify(bVar1,"headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x1f);
  if ((bVar2 & 1) != 0) {
    iVar5 = (int)(pRVar3 + 0x78);
    pHVar4 = (Header *)KDReports::HeaderMap::headerForPage(iVar5,1);
    bVar1 = QTest::qCompare<KDReports::Header>
                      (pHVar4,(Header *)0x0,"headers.headerForPage(1, 2)","( Header * )nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x20);
    if (bVar1) {
      pHVar4 = (Header *)KDReports::HeaderMap::headerForPage(iVar5,2);
      QTest::qCompare<KDReports::Header>
                (pHVar4,(Header *)0x0,"headers.headerForPage(2, 2)","( Header * )nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                 ,0x21);
    }
  }
  KDReports::Report::~Report((Report *)&headers);
  return;
}

Assistant:

void testNoHeaders()
    {
        Report report;
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 2), ( Header * )nullptr);
        QCOMPARE(headers.headerForPage(2, 2), ( Header * )nullptr);
    }